

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::BaseRenderingTestInstance::drawPrimitives
          (BaseRenderingTestInstance *this,Surface *result,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *positionData,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *colorData,
          VkPrimitiveTopology primitiveTopology)

{
  VkBool32 *pVVar1;
  VkCommandBuffer pVVar2;
  VkCommandBuffer_s *pVVar3;
  deUint64 dVar4;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)18>_> data_00;
  RefData<vk::Handle<(vk::HandleType)8>_> data_01;
  RefData<vk::VkCommandBuffer_s_*> data_02;
  VkQueue pVVar5;
  VkDevice pVVar6;
  int iVar7;
  VkResult VVar8;
  MovePtr *this_00;
  size_type sVar9;
  ulong numBytes;
  VkPhysicalDeviceProperties *__src;
  ostream *poVar10;
  NotSupportedError *this_01;
  char *message_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Handle<(vk::HandleType)16> *pHVar11;
  Handle<(vk::HandleType)17> *pHVar12;
  Handle<(vk::HandleType)8> *pHVar13;
  Allocation *pAVar14;
  VkDeviceSize VVar15;
  void *pvVar16;
  Vector<float,_4> *pVVar17;
  Handle<(vk::HandleType)24> *pHVar18;
  VkCommandBuffer_s **ppVVar19;
  Handle<(vk::HandleType)9> *pHVar20;
  Handle<(vk::HandleType)23> *pHVar21;
  Handle<(vk::HandleType)18> *pHVar22;
  Handle<(vk::HandleType)22> *pHVar23;
  VkDeviceMemory memory;
  Handle<(vk::HandleType)6> *pHVar24;
  VkClearValue VVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  Handle<(vk::HandleType)9> *local_cb0;
  Vector<int,_3> local_b34;
  ConstPixelBufferAccess local_b28;
  PixelBufferAccess local_b00;
  VkDeviceMemory local_ad8;
  deUint64 local_ad0;
  undefined8 uStack_ac8;
  VkSubmitInfo submitInfo;
  undefined1 local_a6c [4];
  deUint64 dStack_a68;
  float pointSize;
  deUint64 local_a60;
  deUint64 local_a58;
  deUint64 local_a50;
  deUint64 local_a48;
  undefined8 local_a40;
  VkBufferImageCopy copyRegion;
  VkBufferMemoryBarrier bufferBarrier;
  undefined8 local_9c0;
  VkDeviceSize vertexBufferOffset;
  VkRenderPassBeginInfo renderPassBeginInfo;
  VkClearValue clearValue;
  undefined8 uStack_958;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  Move<vk::VkCommandBuffer_s_*> local_928;
  RefData<vk::VkCommandBuffer_s_*> local_908;
  VkDeviceMemory local_8e8;
  deUint64 local_8e0;
  deUint64 local_8d8;
  uint local_8cc;
  deUint64 local_8c8;
  VkMemoryRequirements local_8c0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_8a8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_898;
  Move<vk::Handle<(vk::HandleType)8>_> local_888;
  RefData<vk::Handle<(vk::HandleType)8>_> local_868;
  undefined1 local_848 [8];
  VkBufferCreateInfo vertexBufferParams;
  Move<vk::Handle<(vk::HandleType)18>_> local_808;
  RefData<vk::Handle<(vk::HandleType)18>_> local_7e8;
  undefined1 local_7c8 [8];
  VkGraphicsPipelineCreateInfo graphicsPipelineParams;
  VkPipelineMultisampleStateCreateInfo multisampleStateParams;
  undefined1 local_700 [8];
  VkPipelineViewportStateCreateInfo viewportStateParams;
  VkRect2D scissor;
  VkViewport viewport;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkPipelineShaderStageCreateInfo shaderStageParams [2];
  stringstream local_5a0 [8];
  stringstream message;
  ostream local_590 [376];
  undefined1 local_418 [8];
  VkPhysicalDeviceProperties properties;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferMemory;
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  undefined1 local_a0 [8];
  Move<vk::Handle<(vk::HandleType)18>_> graphicsPipeline;
  Move<vk::VkCommandBuffer_s_*> commandBuffer;
  size_t attributeBatchSize;
  Allocator *allocator;
  VkQueue pVStack_48;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice vkDevice;
  DeviceInterface *vkd;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvStack_28;
  VkPrimitiveTopology primitiveTopology_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *colorData_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *positionData_local;
  Surface *result_local;
  BaseRenderingTestInstance *this_local;
  
  vkd._4_4_ = primitiveTopology;
  pvStack_28 = colorData;
  colorData_local = positionData;
  positionData_local =
       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)result;
  result_local = (Surface *)this;
  vkDevice = (VkDevice)Context::getDeviceInterface((this->super_TestInstance).m_context);
  queue = (VkQueue)Context::getDevice((this->super_TestInstance).m_context);
  pVStack_48 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  allocator._4_4_ = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  this_00 = (MovePtr *)Context::getDefaultAllocator((this->super_TestInstance).m_context);
  sVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    (colorData_local);
  numBytes = sVar9 * 0x10;
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move
            ((Move<vk::VkCommandBuffer_s_*> *)
             &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
              m_allocator);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_a0);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferMemory.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &properties.sparseProperties.residencyNonResidentStrict);
  __src = Context::getDeviceProperties((this->super_TestInstance).m_context);
  memcpy(local_418,__src,0x338);
  if (properties.limits.maxVertexInputAttributes < numBytes) {
    std::__cxx11::stringstream::stringstream(local_5a0);
    poVar10 = std::operator<<(local_590,"Larger vertex input attribute offset is needed (");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,numBytes);
    poVar10 = std::operator<<(poVar10,") than the available maximum (");
    poVar10 = (ostream *)
              std::ostream::operator<<(poVar10,properties.limits.maxVertexInputAttributes);
    std::operator<<(poVar10,").");
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    message_00 = (char *)std::__cxx11::string::c_str();
    tcu::NotSupportedError::NotSupportedError
              (this_01,message_00,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0x274);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  vertexInputBindingDescription.inputRate = 0x12;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
            (&(this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
            (&(this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  vertexInputAttributeDescriptions[1].format = VK_FORMAT_UNDEFINED;
  vertexInputAttributeDescriptions[1].offset = 0x10;
  vertexInputBindingDescription.binding = 0;
  vertexInputStateParams.pVertexAttributeDescriptions._0_4_ = 0;
  vertexInputStateParams.pVertexAttributeDescriptions._4_4_ = 0;
  vertexInputAttributeDescriptions[0].location = 0x6d;
  vertexInputAttributeDescriptions[0].binding = 0;
  vertexInputAttributeDescriptions[0].format = VK_FORMAT_R4G4_UNORM_PACK8;
  vertexInputAttributeDescriptions[0].offset = 0;
  vertexInputAttributeDescriptions[1].location = 0x6d;
  commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._0_4_ =
       (deUint32)numBytes;
  vertexInputAttributeDescriptions[1].binding =
       (deUint32)
       commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  inputAssemblyStateParams.primitiveRestartEnable = 0x13;
  vertexInputStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputStateParams._4_4_ = 0;
  vertexInputStateParams.pNext._0_4_ = 0;
  vertexInputStateParams.pNext._4_4_ = 1;
  vertexInputStateParams._16_8_ = &vertexInputAttributeDescriptions[1].format;
  vertexInputStateParams.pVertexBindingDescriptions._0_4_ = 2;
  vertexInputStateParams._32_8_ = &vertexInputStateParams.pVertexAttributeDescriptions;
  viewport.minDepth = 2.8026e-44;
  inputAssemblyStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputAssemblyStateParams._4_4_ = 0;
  inputAssemblyStateParams.pNext._0_4_ = 0;
  inputAssemblyStateParams.pNext._4_4_ = vkd._4_4_;
  inputAssemblyStateParams.flags = 0;
  scissor.extent.width = 0;
  scissor.extent.height = 0;
  viewport.x = (float)this->m_renderSize;
  viewport.y = (float)this->m_renderSize;
  viewport.width = 0.0;
  viewport.height = 1.0;
  viewportStateParams.pScissors._0_4_ = 0;
  viewportStateParams.pScissors._4_4_ = 0;
  scissor.offset.x = this->m_renderSize;
  scissor.offset.y = this->m_renderSize;
  local_700._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  viewportStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  viewportStateParams._4_4_ = 0;
  viewportStateParams.pNext._0_4_ = 0;
  viewportStateParams.pNext._4_4_ = 1;
  viewportStateParams._16_8_ = &scissor.extent;
  viewportStateParams.pViewports._0_4_ = 1;
  viewportStateParams._32_8_ = &viewportStateParams.pScissors;
  graphicsPipelineParams.basePipelineIndex = 0x18;
  graphicsPipelineParams._140_4_ = 0;
  local_7c8._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  graphicsPipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  graphicsPipelineParams._4_4_ = 0;
  graphicsPipelineParams.pNext._0_4_ = 0;
  graphicsPipelineParams.pNext._4_4_ = 2;
  graphicsPipelineParams._16_8_ = &vertexInputBindingDescription.inputRate;
  graphicsPipelineParams.pStages =
       (VkPipelineShaderStageCreateInfo *)&inputAssemblyStateParams.primitiveRestartEnable;
  graphicsPipelineParams.pVertexInputState =
       (VkPipelineVertexInputStateCreateInfo *)&viewport.minDepth;
  graphicsPipelineParams.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  graphicsPipelineParams.pTessellationState = (VkPipelineTessellationStateCreateInfo *)local_700;
  iVar7 = (*(this->super_TestInstance)._vptr_TestInstance[5])();
  graphicsPipelineParams.pViewportState =
       (VkPipelineViewportStateCreateInfo *)CONCAT44(extraout_var,iVar7);
  graphicsPipelineParams.pRasterizationState =
       (VkPipelineRasterizationStateCreateInfo *)&graphicsPipelineParams.basePipelineIndex;
  graphicsPipelineParams.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)0x0;
  iVar7 = (*(this->super_TestInstance)._vptr_TestInstance[6])();
  graphicsPipelineParams.pDepthStencilState =
       (VkPipelineDepthStencilStateCreateInfo *)CONCAT44(extraout_var_00,iVar7);
  graphicsPipelineParams.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  graphicsPipelineParams.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pHVar11->m_internal;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  graphicsPipelineParams.layout.m_internal = pHVar12->m_internal;
  graphicsPipelineParams.renderPass.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)18>::Handle
            ((Handle<(vk::HandleType)18> *)&graphicsPipelineParams.subpass,0);
  pVVar6 = vkDevice;
  pVVar5 = queue;
  graphicsPipelineParams.basePipelineHandle.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)15>::Handle
            ((Handle<(vk::HandleType)15> *)&vertexBufferParams.pQueueFamilyIndices,0);
  ::vk::createGraphicsPipeline
            (&local_808,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,
             (VkPipelineCache)vertexBufferParams.pQueueFamilyIndices,
             (VkGraphicsPipelineCreateInfo *)local_7c8,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_7e8,(Move *)&local_808);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_7e8.deleter.m_deviceIface;
  data_00.object.m_internal = local_7e8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_7e8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_7e8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_7e8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_7e8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_7e8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_a0,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_808);
  local_848._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  vertexBufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexBufferParams._4_4_ = 0;
  vertexBufferParams.pNext._0_4_ = 0;
  vertexBufferParams._16_8_ = sVar9 << 5;
  vertexBufferParams.size._0_4_ = 0x80;
  vertexBufferParams.size._4_4_ = 0;
  vertexBufferParams.usage = 1;
  vertexBufferParams._40_8_ = (long)&allocator + 4;
  ::vk::createBuffer(&local_888,(DeviceInterface *)vkDevice,(VkDevice)queue,
                     (VkBufferCreateInfo *)local_848,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_868,(Move *)&local_888);
  uVar26 = (undefined4)local_868.object.m_internal;
  uVar27 = (undefined4)(local_868.object.m_internal >> 0x20);
  uVar28 = SUB84(local_868.deleter.m_deviceIface,0);
  uVar29 = (undefined4)((ulong)local_868.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_deviceIface._0_4_ = uVar28;
  data_01.object.m_internal = local_868.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = uVar29;
  data_01.deleter.m_device._0_4_ = (int)local_868.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_868.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_868.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_868.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferMemory.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_888);
  pVVar6 = vkDevice;
  pVVar5 = queue;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &vertexBufferMemory.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  local_8c8 = pHVar13->m_internal;
  ::vk::getBufferMemoryRequirements
            (&local_8c0,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,(VkBuffer)local_8c8);
  local_8cc = ::vk::MemoryRequirement::HostVisible;
  (*(*(_func_int ***)this_00)[3])
            (&local_8a8,this_00,&local_8c0,(ulong)::vk::MemoryRequirement::HostVisible);
  local_898 = de::details::MovePtr::operator_cast_to_PtrData(&local_8a8,this_00);
  data.ptr._4_4_ = uVar27;
  data.ptr._0_4_ = uVar26;
  data._8_4_ = uVar28;
  data._12_4_ = uVar29;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &properties.sparseProperties.residencyNonResidentStrict,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_8a8);
  pVVar6 = vkDevice;
  pVVar5 = queue;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &vertexBufferMemory.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  local_8d8 = pHVar13->m_internal;
  pVVar1 = &properties.sparseProperties.residencyNonResidentStrict;
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)pVVar1);
  local_8e0 = (deUint64)::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)pVVar1);
  VVar15 = ::vk::Allocation::getOffset(pAVar14);
  VVar8 = (**(code **)(*(long *)pVVar6 + 0x60))(pVVar6,pVVar5,local_8d8,local_8e0,VVar15);
  ::vk::checkResult(VVar8,
                    "vkd.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x30d);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                       &properties.sparseProperties.residencyNonResidentStrict);
  pvVar16 = ::vk::Allocation::getHostPtr(pAVar14);
  pVVar17 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::data
                      (colorData_local);
  ::deMemcpy(pvVar16,pVVar17,numBytes);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                       &properties.sparseProperties.residencyNonResidentStrict);
  pvVar16 = ::vk::Allocation::getHostPtr(pAVar14);
  pVVar17 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::data
                      (pvStack_28);
  ::deMemcpy((void *)((long)pvVar16 + numBytes),pVVar17,numBytes);
  pVVar6 = vkDevice;
  pVVar5 = queue;
  pVVar1 = &properties.sparseProperties.residencyNonResidentStrict;
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)pVVar1);
  local_8e8 = ::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)pVVar1);
  VVar15 = ::vk::Allocation::getOffset(pAVar14);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)pVVar6,(VkDevice)pVVar5,local_8e8,VVar15,vertexBufferParams._16_8_);
  pVVar6 = vkDevice;
  pVVar5 = queue;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      (&(this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  ::vk::allocateCommandBuffer
            (&local_928,(DeviceInterface *)pVVar6,(VkDevice)pVVar5,
             (VkCommandPool)pHVar18->m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_908,(Move *)&local_928);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_908.deleter.m_deviceIface;
  data_02.object = local_908.object;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_908.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_908.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_908.deleter.m_device >> 0x20);
  data_02.deleter.m_pool.m_internal._0_4_ = (int)local_908.deleter.m_pool.m_internal;
  data_02.deleter.m_pool.m_internal._4_4_ = (int)(local_908.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=
            ((Move<vk::VkCommandBuffer_s_*> *)
             &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
              m_allocator,data_02);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_928);
  pVVar6 = vkDevice;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  uStack_958 = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                         deleter.m_allocator);
  VVar8 = (**(code **)(*(long *)pVVar6 + 0x248))(pVVar6,*ppVVar19,&uStack_958);
  ::vk::checkResult(VVar8,"vkd.beginCommandBuffer(*commandBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x322);
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                         deleter.m_allocator);
  pVVar2 = *ppVVar19;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  addImageTransitionBarrier
            (this,pVVar2,(VkImage)pHVar20->m_internal,1,0x10000,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);
  if (this->m_multisampling != 0) {
    ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)
                          &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                           deleter.m_allocator);
    pVVar2 = *ppVVar19;
    pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    addImageTransitionBarrier
              (this,pVVar2,(VkImage)pHVar20->m_internal,1,0x10000,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
               VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);
  }
  VVar25 = ::vk::makeClearValueColorF32(0.0,0.0,0.0,1.0);
  renderPassBeginInfo.pClearValues = (VkClearValue *)VVar25.depthStencil;
  vertexBufferOffset._0_4_ = 0x2b;
  renderPassBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassBeginInfo._4_4_ = 0;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  renderPassBeginInfo.pNext = (void *)pHVar12->m_internal;
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      (&(this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  pVVar6 = vkDevice;
  renderPassBeginInfo.renderPass.m_internal = pHVar21->m_internal;
  renderPassBeginInfo.framebuffer.m_internal._0_4_ = 0;
  renderPassBeginInfo.framebuffer.m_internal._4_4_ = 0;
  renderPassBeginInfo.renderArea.offset.x = this->m_renderSize;
  renderPassBeginInfo.renderArea.offset.y = this->m_renderSize;
  renderPassBeginInfo.renderArea.extent.width = 1;
  renderPassBeginInfo._48_8_ = &renderPassBeginInfo.pClearValues;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                         deleter.m_allocator);
  (**(code **)(*(long *)pVVar6 + 0x3a0))(pVVar6,*ppVVar19,&vertexBufferOffset,0);
  pVVar6 = vkDevice;
  local_9c0 = 0;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                         deleter.m_allocator);
  pVVar3 = *ppVVar19;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_a0);
  (**(code **)(*(long *)pVVar6 + 0x260))(pVVar6,pVVar3,0,pHVar22->m_internal);
  pVVar6 = vkDevice;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                         deleter.m_allocator);
  pVVar3 = *ppVVar19;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  dVar4 = pHVar11->m_internal;
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (**(code **)(*(long *)pVVar6 + 0x2b0))(pVVar6,pVVar3,0,dVar4,0,1,(int)pHVar23,0,0);
  pVVar6 = vkDevice;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                         deleter.m_allocator);
  pVVar3 = *ppVVar19;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                       &vertexBufferMemory.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
  (**(code **)(*(long *)pVVar6 + 0x2c0))(pVVar6,pVVar3,0,1,pHVar13,&local_9c0);
  pVVar6 = vkDevice;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                         deleter.m_allocator);
  pVVar3 = *ppVVar19;
  sVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    (colorData_local);
  (**(code **)(*(long *)pVVar6 + 0x2c8))(pVVar6,pVVar3,sVar9 & 0xffffffff,1,0);
  pVVar6 = vkDevice;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                         deleter.m_allocator);
  (**(code **)(*(long *)pVVar6 + 0x3b0))(pVVar6,*ppVVar19);
  copyRegion.imageExtent.height = 0x2c;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
            (&(this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_a40 = 0;
  copyRegion.bufferOffset._0_4_ = this->m_renderSize;
  copyRegion.bufferOffset._4_4_ = this->m_renderSize;
  copyRegion.bufferRowLength = 1;
  copyRegion.bufferImageHeight = 0;
  copyRegion.imageSubresource.aspectMask = 0;
  copyRegion.imageSubresource.mipLevel = 1;
  copyRegion.imageSubresource.baseArrayLayer = 0;
  copyRegion.imageSubresource.layerCount = 0;
  copyRegion.imageOffset.x = 0;
  copyRegion.imageOffset.y = this->m_renderSize;
  copyRegion.imageOffset.z = this->m_renderSize;
  copyRegion.imageExtent.width = 1;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                         deleter.m_allocator);
  pVVar2 = *ppVVar19;
  if (this->m_multisampling == 0) {
    local_cb0 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                          (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  }
  else {
    local_cb0 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                          (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  }
  local_a48 = local_cb0->m_internal;
  addImageTransitionBarrier
            (this,pVVar2,(VkImage)local_a48,0x400,0x1000,0x100,0x800,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);
  pVVar6 = vkDevice;
  if (this->m_multisampling == 0) {
    ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)
                          &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                           deleter.m_allocator);
    pVVar3 = *ppVVar19;
    pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    local_a60 = pHVar20->m_internal;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        (&(this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    dStack_a68 = pHVar13->m_internal;
    (**(code **)(*(long *)pVVar6 + 0x318))(pVVar6,pVVar3,local_a60,6,dStack_a68,1,(int)&local_a40);
  }
  else {
    ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)
                          &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                           deleter.m_allocator);
    pVVar3 = *ppVVar19;
    pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    local_a50 = pHVar20->m_internal;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        (&(this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    local_a58 = pHVar13->m_internal;
    (**(code **)(*(long *)pVVar6 + 0x318))(pVVar6,pVVar3,local_a50,6,local_a58,1,(int)&local_a40);
  }
  pVVar6 = vkDevice;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                         deleter.m_allocator);
  (**(code **)(*(long *)pVVar6 + 0x368))
            (pVVar6,*ppVVar19,0x1000,0x4000,0,0,0,1,(int)&copyRegion.imageExtent.height,0,0);
  pVVar6 = vkDevice;
  ppVVar19 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                         deleter.m_allocator);
  VVar8 = (**(code **)(*(long *)pVVar6 + 0x250))(pVVar6,*ppVVar19);
  ::vk::checkResult(VVar8,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x37f);
  (*(this->super_TestInstance)._vptr_TestInstance[4])();
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_uniformBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  pvVar16 = ::vk::Allocation::getHostPtr(pAVar14);
  ::deMemcpy(pvVar16,local_a6c,this->m_uniformBufferSize);
  pVVar6 = vkDevice;
  pVVar5 = queue;
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_uniformBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  memory = ::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_uniformBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar15 = ::vk::Allocation::getOffset(pAVar14);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)pVVar6,(VkDevice)pVVar5,memory,VVar15,this->m_uniformBufferSize);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_ac8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)
                  &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                   m_allocator);
  pVVar6 = vkDevice;
  pVVar5 = queue;
  pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  VVar8 = (**(code **)(*(long *)pVVar6 + 0xa0))(pVVar6,pVVar5,1,pHVar24);
  ::vk::checkResult(VVar8,"vkd.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x397);
  pVVar6 = vkDevice;
  pVVar5 = pVStack_48;
  pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  local_ad0 = pHVar24->m_internal;
  VVar8 = (**(code **)(*(long *)pVVar6 + 0x10))(pVVar6,pVVar5,1,&uStack_ac8,local_ad0);
  ::vk::checkResult(VVar8,"vkd.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x398);
  pVVar6 = vkDevice;
  pVVar5 = queue;
  pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  VVar8 = (**(code **)(*(long *)pVVar6 + 0xb0))(pVVar6,pVVar5,1,pHVar24,1,0xffffffffffffffff);
  ::vk::checkResult(VVar8,"vkd.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                    ,0x399);
  pVVar6 = vkDevice;
  pVVar5 = queue;
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_resultBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  local_ad8 = ::vk::Allocation::getMemory(pAVar14);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_resultBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar15 = ::vk::Allocation::getOffset(pAVar14);
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)pVVar6,(VkDevice)pVVar5,local_ad8,VVar15,this->m_resultBufferSize);
  tcu::Surface::getAccess(&local_b00,(Surface *)positionData_local);
  tcu::Vector<int,_3>::Vector(&local_b34,this->m_renderSize,this->m_renderSize,1);
  pAVar14 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_resultBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  pvVar16 = ::vk::Allocation::getHostPtr(pAVar14);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_b28,&this->m_textureFormat,&local_b34,pvVar16);
  tcu::copy((EVP_PKEY_CTX *)&local_b00,(EVP_PKEY_CTX *)&local_b28);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             &properties.sparseProperties.residencyNonResidentStrict);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferMemory.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_a0);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
            ((Move<vk::VkCommandBuffer_s_*> *)
             &graphicsPipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
              m_allocator);
  return;
}

Assistant:

void BaseRenderingTestInstance::drawPrimitives (tcu::Surface& result, const std::vector<tcu::Vec4>& positionData, const std::vector<tcu::Vec4>& colorData, VkPrimitiveTopology primitiveTopology)
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const VkQueue								queue					= m_context.getUniversalQueue();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();
	const size_t								attributeBatchSize		= positionData.size() * sizeof(tcu::Vec4);

	Move<VkCommandBuffer>						commandBuffer;
	Move<VkPipeline>							graphicsPipeline;
	Move<VkBuffer>								vertexBuffer;
	de::MovePtr<Allocation>						vertexBufferMemory;
	const VkPhysicalDeviceProperties			properties				= m_context.getDeviceProperties();

	if (attributeBatchSize > properties.limits.maxVertexInputAttributeOffset)
	{
		std::stringstream message;
		message << "Larger vertex input attribute offset is needed (" << attributeBatchSize << ") than the available maximum (" << properties.limits.maxVertexInputAttributeOffset << ").";
		TCU_THROW(NotSupportedError, message.str().c_str());
	}

	// Create Graphics Pipeline
	{
		const VkPipelineShaderStageCreateInfo	shaderStageParams[2]	=
		{
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,		// VkStructureType					sType;
				DE_NULL,													// const void*						pNext;
				0,															// VkPipelineShaderStageCreateFlags flags;
				VK_SHADER_STAGE_VERTEX_BIT,									// VkShaderStage					stage;
				*m_vertexShaderModule,										// VkShader							shader;
				"main",														// const char*						pName;
				DE_NULL														// const VkSpecializationInfo*		pSpecializationInfo;
			},
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,		// VkStructureType					sType;
				DE_NULL,													// const void*						pNext;
				0,															// VkPipelineShaderStageCreateFlags flags;
				VK_SHADER_STAGE_FRAGMENT_BIT,								// VkShaderStage					stage;
				*m_fragmentShaderModule,									// VkShader							shader;
				"main",														// const char*						pName;
				DE_NULL														// const VkSpecializationInfo*		pSpecializationInfo;
			}
		};

		const VkVertexInputBindingDescription	vertexInputBindingDescription =
		{
			0u,								// deUint32					binding;
			sizeof(tcu::Vec4),				// deUint32					strideInBytes;
			VK_VERTEX_INPUT_RATE_VERTEX		// VkVertexInputStepRate	stepRate;
		};

		const VkVertexInputAttributeDescription	vertexInputAttributeDescriptions[2] =
		{
			{
				0u,									// deUint32	location;
				0u,									// deUint32	binding;
				VK_FORMAT_R32G32B32A32_SFLOAT,		// VkFormat	format;
				0u									// deUint32	offsetInBytes;
			},
			{
				1u,									// deUint32	location;
				0u,									// deUint32	binding;
				VK_FORMAT_R32G32B32A32_SFLOAT,		// VkFormat	format;
				(deUint32)attributeBatchSize		// deUint32	offsetInBytes;
			}
		};

		const VkPipelineVertexInputStateCreateInfo	vertexInputStateParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType							sType;
			DE_NULL,														// const void*								pNext;
			0,																// VkPipelineVertexInputStateCreateFlags	flags;
			1u,																// deUint32									bindingCount;
			&vertexInputBindingDescription,									// const VkVertexInputBindingDescription*	pVertexBindingDescriptions;
			2u,																// deUint32									attributeCount;
			vertexInputAttributeDescriptions								// const VkVertexInputAttributeDescription*	pVertexAttributeDescriptions;
		};

		const VkPipelineInputAssemblyStateCreateInfo	inputAssemblyStateParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType							sType;
			DE_NULL,														// const void*								pNext;
			0,																// VkPipelineInputAssemblyStateCreateFlags	flags;
			primitiveTopology,												// VkPrimitiveTopology						topology;
			false															// VkBool32									primitiveRestartEnable;
		};

		const VkViewport						viewport =
		{
			0.0f,						// float	originX;
			0.0f,						// float	originY;
			(float)m_renderSize,		// float	width;
			(float)m_renderSize,		// float	height;
			0.0f,						// float	minDepth;
			1.0f						// float	maxDepth;
		};

		const VkRect2D							scissor =
		{
			{ 0, 0 },														// VkOffset2D  offset;
			{ m_renderSize, m_renderSize }									// VkExtent2D  extent;
		};

		const VkPipelineViewportStateCreateInfo	viewportStateParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,			// VkStructureType						sType;
			DE_NULL,														// const void*							pNext;
			0,																// VkPipelineViewportStateCreateFlags	flags;
			1u,																// deUint32								viewportCount;
			&viewport,														// const VkViewport*					pViewports;
			1u,																// deUint32								scissorCount;
			&scissor														// const VkRect2D*						pScissors;
		};

		const VkPipelineMultisampleStateCreateInfo multisampleStateParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,		// VkStructureType							sType;
			DE_NULL,														// const void*								pNext;
			0u,																// VkPipelineMultisampleStateCreateFlags	flags;
			m_sampleCount,													// VkSampleCountFlagBits					rasterizationSamples;
			VK_FALSE,														// VkBool32									sampleShadingEnable;
			0.0f,															// float									minSampleShading;
			DE_NULL,														// const VkSampleMask*						pSampleMask;
			VK_FALSE,														// VkBool32									alphaToCoverageEnable;
			VK_FALSE														// VkBool32									alphaToOneEnable;
		};

		const VkGraphicsPipelineCreateInfo graphicsPipelineParams =
		{
			VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,	// VkStructureType									sType;
			DE_NULL,											// const void*										pNext;
			0u,													// VkPipelineCreateFlags							flags;
			2u,													// deUint32											stageCount;
			shaderStageParams,									// const VkPipelineShaderStageCreateInfo*			pStages;
			&vertexInputStateParams,							// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
			&inputAssemblyStateParams,							// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
			DE_NULL,											// const VkPipelineTessellationStateCreateInfo*		pTessellationState;
			&viewportStateParams,								// const VkPipelineViewportStateCreateInfo*			pViewportState;
			getRasterizationStateCreateInfo(),					// const VkPipelineRasterStateCreateInfo*			pRasterizationState;
			&multisampleStateParams,							// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
			DE_NULL,											// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
			getColorBlendStateCreateInfo(),						// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
			DE_NULL,											// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
			*m_pipelineLayout,									// VkPipelineLayout									layout;
			*m_renderPass,										// VkRenderPass										renderPass;
			0u,													// deUint32											subpass;
			0u,													// VkPipeline										basePipelineHandle;
			0u													// deInt32											basePipelineIndex;
		};

		graphicsPipeline		= createGraphicsPipeline(vkd, vkDevice, DE_NULL, &graphicsPipelineParams);
	}

	// Create Vertex Buffer
	{
		const VkBufferCreateInfo			vertexBufferParams		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			attributeBatchSize * 2,						// VkDeviceSize			size;
			VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		vertexBuffer		= createBuffer(vkd, vkDevice, &vertexBufferParams);
		vertexBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *vertexBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset()));

		// Load vertices into vertex buffer
		deMemcpy(vertexBufferMemory->getHostPtr(), positionData.data(), attributeBatchSize);
		deMemcpy(reinterpret_cast<deUint8*>(vertexBufferMemory->getHostPtr()) +  attributeBatchSize, colorData.data(), attributeBatchSize);
		flushMappedMemoryRange(vkd, vkDevice, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset(), vertexBufferParams.size);
	}

	// Create Command Buffer
	commandBuffer = allocateCommandBuffer(vkd, vkDevice, *m_commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Begin Command Buffer
	{
		const VkCommandBufferBeginInfo		cmdBufferBeginInfo		=
		{
			VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType							sType;
			DE_NULL,										// const void*								pNext;
			0u,												// VkCmdBufferOptimizeFlags					flags;
			DE_NULL											// const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
		};

		VK_CHECK(vkd.beginCommandBuffer(*commandBuffer, &cmdBufferBeginInfo));
	}

	addImageTransitionBarrier(*commandBuffer, *m_image,
							  VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT,				// VkPipelineStageFlags		srcStageMask
							  VK_PIPELINE_STAGE_ALL_COMMANDS_BIT,				// VkPipelineStageFlags		dstStageMask
							  0,												// VkAccessFlags			srcAccessMask
							  VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags			dstAccessMask
							  VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
							  VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);		// VkImageLayout			newLayout;

	if (m_multisampling) {
		addImageTransitionBarrier(*commandBuffer, *m_resolvedImage,
								  VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT,				// VkPipelineStageFlags		srcStageMask
								  VK_PIPELINE_STAGE_ALL_COMMANDS_BIT,				// VkPipelineStageFlags		dstStageMask
								  0,												// VkAccessFlags			srcAccessMask
								  VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags			dstAccessMask
								  VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
								  VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);		// VkImageLayout			newLayout;
	}

	// Begin Render Pass
	{
		const VkClearValue					clearValue				= makeClearValueColorF32(0.0, 0.0, 0.0, 1.0);

		const VkRenderPassBeginInfo			renderPassBeginInfo		=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,				// VkStructureType		sType;
			DE_NULL,												// const void*			pNext;
			*m_renderPass,											// VkRenderPass			renderPass;
			*m_frameBuffer,											// VkFramebuffer		framebuffer;
			{
				{ 0, 0 },
				{ m_renderSize, m_renderSize }
			},														// VkRect2D				renderArea;
			1u,														// deUint32				clearValueCount;
			&clearValue												// const VkClearValue*	pClearValues;
		};

		vkd.cmdBeginRenderPass(*commandBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
	}

	const VkDeviceSize						vertexBufferOffset		= 0;

	vkd.cmdBindPipeline(*commandBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *graphicsPipeline);
	vkd.cmdBindDescriptorSets(*commandBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipelineLayout, 0u, 1, &m_descriptorSet.get(), 0u, DE_NULL);
	vkd.cmdBindVertexBuffers(*commandBuffer, 0, 1, &vertexBuffer.get(), &vertexBufferOffset);
	vkd.cmdDraw(*commandBuffer, (deUint32)positionData.size(), 1, 0, 0);
	vkd.cmdEndRenderPass(*commandBuffer);

	// Copy Image
	{

		const VkBufferMemoryBarrier			bufferBarrier			=
		{
			VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			VK_ACCESS_TRANSFER_WRITE_BIT,				// VkMemoryOutputFlags	outputMask;
			VK_ACCESS_HOST_READ_BIT,					// VkMemoryInputFlags	inputMask;
			VK_QUEUE_FAMILY_IGNORED,					// deUint32				srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,					// deUint32				destQueueFamilyIndex;
			*m_resultBuffer,							// VkBuffer				buffer;
			0u,											// VkDeviceSize			offset;
			m_resultBufferSize							// VkDeviceSize			size;
		};

		const VkBufferImageCopy				copyRegion				=
		{
			0u,											// VkDeviceSize				bufferOffset;
			m_renderSize,								// deUint32					bufferRowLength;
			m_renderSize,								// deUint32					bufferImageHeight;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u },	// VkImageSubresourceCopy	imageSubresource;
			{ 0, 0, 0 },								// VkOffset3D				imageOffset;
			{ m_renderSize, m_renderSize, 1u }			// VkExtent3D				imageExtent;
		};

		addImageTransitionBarrier(*commandBuffer,
								  m_multisampling ? *m_resolvedImage : *m_image,
								  VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT,		// VkPipelineStageFlags		srcStageMask
								  VK_PIPELINE_STAGE_TRANSFER_BIT,						// VkPipelineStageFlags		dstStageMask
								  VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,					// VkAccessFlags			srcAccessMask
								  VK_ACCESS_TRANSFER_READ_BIT,							// VkAccessFlags			dstAccessMask
								  VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,				// VkImageLayout			oldLayout;
								  VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);				// VkImageLayout			newLayout;)

		if (m_multisampling)
			vkd.cmdCopyImageToBuffer(*commandBuffer, *m_resolvedImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *m_resultBuffer, 1, &copyRegion);
		else
			vkd.cmdCopyImageToBuffer(*commandBuffer, *m_image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *m_resultBuffer, 1, &copyRegion);

		vkd.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &bufferBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vkd.endCommandBuffer(*commandBuffer));

	// Set Point Size
	{
		float	pointSize	= getPointSize();
		deMemcpy(m_uniformBufferMemory->getHostPtr(), &pointSize, (size_t)m_uniformBufferSize);
		flushMappedMemoryRange(vkd, vkDevice, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset(), m_uniformBufferSize);
	}

	// Submit
	{
		const VkSubmitInfo					submitInfo				=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType				sType;
			DE_NULL,								// const void*					pNext;
			0u,										// deUint32						waitSemaphoreCount;
			DE_NULL,								// const VkSemaphore*			pWaitSemaphores;
			DE_NULL,								// const VkPipelineStageFlags*	pWaitDstStageMask;
			1u,										// deUint32						commandBufferCount;
			&commandBuffer.get(),					// const VkCommandBuffer*		pCommandBuffers;
			0u,										// deUint32						signalSemaphoreCount;
			DE_NULL,								// const VkSemaphore*			pSignalSemaphores;
		};

		VK_CHECK(vkd.resetFences(vkDevice, 1, &m_fence.get()));
		VK_CHECK(vkd.queueSubmit(queue, 1, &submitInfo, *m_fence));
		VK_CHECK(vkd.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity */));
	}

	invalidateMappedMemoryRange(vkd, vkDevice, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset(), m_resultBufferSize);
	tcu::copy(result.getAccess(), tcu::ConstPixelBufferAccess(m_textureFormat, tcu::IVec3(m_renderSize, m_renderSize, 1), m_resultBufferMemory->getHostPtr()));
}